

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

void redisAsyncDisconnect(redisAsyncContext *ac)

{
  int *piVar1;
  uint uVar2;
  _func_void_void_ptr *p_Var3;
  int iVar4;
  redisContext *c;
  
  uVar2 = (ac->c).flags;
  (ac->c).flags = uVar2 & 0xfffffdfb | 4;
  if (((uVar2 & 0x10) != 0) || ((ac->replies).head != (redisCallback *)0x0)) {
    return;
  }
  iVar4 = _DAT_00000118;
  if (ac != (redisAsyncContext *)0x0) {
    iVar4 = (ac->c).err;
    ac->err = iVar4;
    ac->errstr = (ac->c).errstr;
  }
  if (iVar4 == 0) {
    iVar4 = __redisShiftCallback(&ac->replies,(redisCallback *)0x0);
    if (iVar4 != -1) {
      __assert_fail("ret == REDIS_ERR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/async.c"
                    ,0x148,"void __redisAsyncDisconnect(redisAsyncContext *)");
    }
  }
  else {
    piVar1 = &(ac->c).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 4;
  }
  p_Var3 = (ac->ev).cleanup;
  if (p_Var3 != (_func_void_void_ptr *)0x0) {
    (*p_Var3)((ac->ev).data);
  }
  (ac->ev).cleanup = (_func_void_void_ptr *)0x0;
  if (((ac->c).flags & 0x200) != 0) {
    return;
  }
  __redisAsyncFree(ac);
  return;
}

Assistant:

void redisAsyncDisconnect(redisAsyncContext *ac) {
    redisContext *c = &(ac->c);
    c->flags |= REDIS_DISCONNECTING;

    /** unset the auto-free flag here, because disconnect undoes this */
    c->flags &= ~REDIS_NO_AUTO_FREE;
    if (!(c->flags & REDIS_IN_CALLBACK) && ac->replies.head == NULL)
        __redisAsyncDisconnect(ac);
}